

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ReadListFileAsString(cmMakefile *this,string *content,string *virtualFileName)

{
  bool bVar1;
  bool bVar2;
  string *in_base;
  ListFileScope scope;
  cmListFile listFile;
  string filenametoread;
  ListFileScope LStack_78;
  cmListFile local_68;
  string local_48;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_48,virtualFileName,in_base);
  ListFileScope::ListFileScope(&LStack_78,this,&local_48);
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = cmListFile::ParseString
                    (&local_68,(content->_M_dataplus)._M_p,(virtualFileName->_M_dataplus)._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar1) {
    RunListFile(this,&local_68,&local_48,(DeferCommands *)0x0);
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar2) {
      LStack_78.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_68.Functions)
  ;
  ListFileScope::~ListFileScope(&LStack_78);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFileAsString(const std::string& content,
                                      const std::string& virtualFileName)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    virtualFileName, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseString(content.c_str(), virtualFileName.c_str(),
                            this->GetMessenger(), this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}